

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O2

void __thiscall QTcpServerPrivate::~QTcpServerPrivate(QTcpServerPrivate *this)

{
  *(undefined ***)this = &PTR__QTcpServerPrivate_002cbba0;
  (this->super_QAbstractSocketEngineReceiver)._vptr_QAbstractSocketEngineReceiver =
       (_func_int **)&PTR__QTcpServerPrivate_002cbc10;
  QNetworkProxy::~QNetworkProxy(&this->proxy);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->serverSocketErrorString).d);
  QHostAddress::~QHostAddress(&this->address);
  QArrayDataPointer<QTcpSocket_*>::~QArrayDataPointer(&(this->pendingConnections).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QTcpServerPrivate::~QTcpServerPrivate()
{
}